

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall libDAI::Exception::Exception(Exception *this,size_t code,string *msg)

{
  runtime_error *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_78 [8];
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  string local_58 [32];
  string local_38 [56];
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(in_stack_ffffffffffffff78,__rhs);
  std::operator+(in_stack_ffffffffffffff78,(char *)__rhs);
  std::runtime_error::runtime_error(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  *(undefined ***)in_RDI = &PTR__Exception_00d042a0;
  return;
}

Assistant:

Exception(size_t code, const std::string& msg = "") : std::runtime_error(ErrorStrings[code] + " [" +  msg + "]") {}